

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_3a42bf::Handlers::endCopyAttachmentsFrom(Handlers *this)

{
  __shared_ptr<QPDFJob::CopyAttConfig,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  QPDFJob::CopyAttConfig::endCopyAttachmentsFrom
            ((this->c_copy_att).
             super___shared_ptr<QPDFJob::CopyAttConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_18._M_ptr = (element_type *)0x0;
  local_18._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<QPDFJob::CopyAttConfig,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->c_copy_att).
              super___shared_ptr<QPDFJob::CopyAttConfig,_(__gnu_cxx::_Lock_policy)2>,&local_18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18._M_refcount);
  return;
}

Assistant:

void
Handlers::endCopyAttachmentsFrom()
{
    this->c_copy_att->endCopyAttachmentsFrom();
    this->c_copy_att = nullptr;
}